

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManFromIfLogicFindLut
              (If_Man_t *pIfMan,Gia_Man_t *pNew,If_Cut_t *pCutBest,sat_solver *pSat,
              Vec_Int_t *vLeaves,Vec_Int_t *vLits,Vec_Int_t *vCover,Vec_Int_t *vMapping,
              Vec_Int_t *vMapping2,Vec_Int_t *vPacking)

{
  If_DsdMan_t *pIVar1;
  word wVar2;
  Vec_Int_t *pSat_00;
  If_Cut_t *pIVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  word *pwVar7;
  Gia_Obj_t *pObj;
  char *pcVar8;
  long lVar9;
  int Value_1;
  int Value;
  int iVar;
  char *pPerm;
  int k;
  int RetValue2;
  int RetValue;
  uint uSetOld;
  uint uSetNew;
  int pVarsS [15];
  int nVarsS;
  int pVarsB [15];
  int nVarsB;
  int pVarsF [15];
  int nVarsF;
  int nLutSize;
  word uFree;
  word uBound;
  Vec_Int_t *vLits_local;
  Vec_Int_t *vLeaves_local;
  sat_solver *pSat_local;
  If_Cut_t *pCutBest_local;
  Gia_Man_t *pNew_local;
  If_Man_t *pIfMan_local;
  
  iVar4 = *pIfMan->pPars->pLutStruct + -0x30;
  pVarsF[0xe] = 0;
  pVarsB[0xd] = 0;
  pVarsS[0xd] = 0;
  uBound = (word)vLits;
  vLits_local = vLeaves;
  vLeaves_local = (Vec_Int_t *)pSat;
  pSat_local = (sat_solver *)pCutBest;
  pCutBest_local = (If_Cut_t *)pNew;
  pNew_local = (Gia_Man_t *)pIfMan;
  iVar5 = Vec_IntSize(vLeaves);
  pIVar3 = pCutBest_local;
  if (iVar4 < iVar5) {
    pIVar1 = (If_DsdMan_t *)pNew_local[1].vDoms;
    iVar5 = If_CutDsdLit((If_Man_t *)pNew_local,(If_Cut_t *)pSat_local);
    uVar6 = If_DsdManSuppSize(pIVar1,iVar5);
    if (uVar6 != (uint)(pSat_local->Mem).BookMarkH[1] >> 0x18) {
      __assert_fail("If_DsdManSuppSize(pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest)) == (int)pCutBest->nLeaves"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                    ,0x583,
                    "int Gia_ManFromIfLogicFindLut(If_Man_t *, Gia_Man_t *, If_Cut_t *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    if (*(int *)(pNew_local->pSpec + 0x54) == 0) {
      pIVar1 = (If_DsdMan_t *)pNew_local[1].vDoms;
      iVar5 = If_CutDsdLit((If_Man_t *)pNew_local,(If_Cut_t *)pSat_local);
      RetValue2 = If_DsdManCheckXY(pIVar1,iVar5,iVar4,1,0,1,0);
    }
    else {
      RetValue2 = (pSat_local->Mem).nEntries[1];
    }
    RetValue = 0;
    pcVar8 = If_CutDsdPerm((If_Man_t *)pNew_local,(If_Cut_t *)pSat_local);
    for (pPerm._4_4_ = 0; iVar5 = If_CutLeaveNum((If_Cut_t *)pSat_local), pSat_00 = vLeaves_local,
        (int)pPerm._4_4_ < iVar5; pPerm._4_4_ = pPerm._4_4_ + 1) {
      iVar5 = Abc_Lit2Var((int)pcVar8[(int)pPerm._4_4_]);
      uVar6 = (uint)RetValue2 >> ((byte)(pPerm._4_4_ << 1) & 0x1f) & 3;
      if (uVar6 == 1) {
        RetValue = 1 << ((byte)(iVar5 << 1) & 0x1f) | RetValue;
      }
      else if (uVar6 == 3) {
        RetValue = 3 << ((byte)(iVar5 << 1) & 0x1f) | RetValue;
      }
      else if (uVar6 != 0) {
        __assert_fail("Value == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                      ,0x594,
                      "int Gia_ManFromIfLogicFindLut(If_Man_t *, Gia_Man_t *, If_Cut_t *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
    }
    pwVar7 = If_CutTruthW((If_Man_t *)pNew_local,(If_Cut_t *)pSat_local);
    iVar4 = If_ManSatCheckXY(pSat_00,iVar4,pwVar7,(uint)(pSat_local->Mem).BookMarkH[1] >> 0x18,
                             RetValue,&uFree,(word *)&nVarsF,(Vec_Int_t *)uBound);
    if (iVar4 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                    ,0x597,
                    "int Gia_ManFromIfLogicFindLut(If_Man_t *, Gia_Man_t *, If_Cut_t *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    for (pPerm._4_4_ = 0; iVar4 = If_CutLeaveNum((If_Cut_t *)pSat_local), (int)pPerm._4_4_ < iVar4;
        pPerm._4_4_ = pPerm._4_4_ + 1) {
      uVar6 = (uint)RetValue >> ((byte)(pPerm._4_4_ << 1) & 0x1f) & 3;
      if (uVar6 == 0) {
        pVarsB[(long)pVarsF[0xe] + 0xe] = pPerm._4_4_;
        pVarsF[0xe] = pVarsF[0xe] + 1;
      }
      else if (uVar6 == 1) {
        lVar9 = (long)pVarsB[0xd];
        pVarsB[0xd] = pVarsB[0xd] + 1;
        pVarsS[lVar9 + 0xe] = pPerm._4_4_;
      }
      else if (uVar6 == 3) {
        lVar9 = (long)pVarsS[0xd];
        pVarsS[0xd] = pVarsS[0xd] + 1;
        (&uSetOld)[lVar9] = pPerm._4_4_;
      }
      else if (uVar6 != 0) {
        __assert_fail("Value == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                      ,0x5a2,
                      "int Gia_ManFromIfLogicFindLut(If_Man_t *, Gia_Man_t *, If_Cut_t *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
    }
    Vec_IntClear((Vec_Int_t *)uBound);
    for (pPerm._4_4_ = 0; wVar2 = uBound, (int)pPerm._4_4_ < pVarsS[0xd];
        pPerm._4_4_ = pPerm._4_4_ + 1) {
      iVar4 = Vec_IntEntry(vLits_local,(&uSetOld)[(int)pPerm._4_4_]);
      Vec_IntPush((Vec_Int_t *)wVar2,iVar4);
    }
    for (pPerm._4_4_ = 0; wVar2 = uBound, (int)pPerm._4_4_ < pVarsB[0xd];
        pPerm._4_4_ = pPerm._4_4_ + 1) {
      iVar4 = Vec_IntEntry(vLits_local,pVarsS[(long)(int)pPerm._4_4_ + 0xe]);
      Vec_IntPush((Vec_Int_t *)wVar2,iVar4);
    }
    iVar4 = Gia_ManFromIfLogicCreateLut
                      ((Gia_Man_t *)pCutBest_local,&uFree,(Vec_Int_t *)uBound,vCover,vMapping,
                       vMapping2);
    Vec_IntClear((Vec_Int_t *)uBound);
    Vec_IntPush((Vec_Int_t *)uBound,iVar4);
    for (pPerm._4_4_ = 0; wVar2 = uBound, (int)pPerm._4_4_ < pVarsS[0xd];
        pPerm._4_4_ = pPerm._4_4_ + 1) {
      iVar5 = Vec_IntEntry(vLits_local,(&uSetOld)[(int)pPerm._4_4_]);
      Vec_IntPush((Vec_Int_t *)wVar2,iVar5);
    }
    for (pPerm._4_4_ = 0; wVar2 = uBound, (int)pPerm._4_4_ < pVarsF[0xe];
        pPerm._4_4_ = pPerm._4_4_ + 1) {
      iVar5 = Vec_IntEntry(vLits_local,pVarsB[(long)(int)pPerm._4_4_ + 0xe]);
      Vec_IntPush((Vec_Int_t *)wVar2,iVar5);
    }
    iVar5 = Gia_ManFromIfLogicCreateLut
                      ((Gia_Man_t *)pCutBest_local,(word *)&nVarsF,(Vec_Int_t *)uBound,vCover,
                       vMapping,vMapping2);
    Vec_IntPush(vPacking,2);
    iVar4 = Abc_Lit2Var(iVar4);
    Vec_IntPush(vPacking,iVar4);
    iVar4 = Abc_Lit2Var(iVar5);
    Vec_IntPush(vPacking,iVar4);
    Vec_IntAddToEntry(vPacking,0,1);
    pIfMan_local._4_4_ = iVar5;
  }
  else {
    pwVar7 = If_CutTruthW((If_Man_t *)pNew_local,(If_Cut_t *)pSat_local);
    iVar4 = Gia_ManFromIfLogicCreateLut
                      ((Gia_Man_t *)pIVar3,pwVar7,vLits_local,vCover,vMapping,vMapping2);
    pIVar3 = pCutBest_local;
    iVar5 = Abc_Lit2Var(iVar4);
    pObj = Gia_ManObj((Gia_Man_t *)pIVar3,iVar5);
    iVar5 = Gia_ObjIsCi(pObj);
    pIfMan_local._4_4_ = iVar4;
    if ((iVar5 == 0) && (1 < iVar4)) {
      Vec_IntPush(vPacking,1);
      iVar4 = Abc_Lit2Var(iVar4);
      Vec_IntPush(vPacking,iVar4);
      Vec_IntAddToEntry(vPacking,0,1);
    }
  }
  return pIfMan_local._4_4_;
}

Assistant:

int Gia_ManFromIfLogicFindLut( If_Man_t * pIfMan, Gia_Man_t * pNew, If_Cut_t * pCutBest, sat_solver * pSat, Vec_Int_t * vLeaves, Vec_Int_t * vLits, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2, Vec_Int_t * vPacking )
{
    word uBound, uFree;
    int nLutSize = (int)(pIfMan->pPars->pLutStruct[0] - '0');
    int nVarsF = 0, pVarsF[IF_MAX_FUNC_LUTSIZE];
    int nVarsB = 0, pVarsB[IF_MAX_FUNC_LUTSIZE];
    int nVarsS = 0, pVarsS[IF_MAX_FUNC_LUTSIZE];
    unsigned uSetNew, uSetOld;
    int RetValue, RetValue2, k;
    char * pPerm;
    if ( Vec_IntSize(vLeaves) <= nLutSize )
    {
        RetValue = Gia_ManFromIfLogicCreateLut( pNew, If_CutTruthW(pIfMan, pCutBest), vLeaves, vCover, vMapping, vMapping2 );
        // write packing
        if ( !Gia_ObjIsCi(Gia_ManObj(pNew, Abc_Lit2Var(RetValue))) && RetValue > 1 )
        {
            Vec_IntPush( vPacking, 1 );
            Vec_IntPush( vPacking, Abc_Lit2Var(RetValue) );
            Vec_IntAddToEntry( vPacking, 0, 1 );
        }
        return RetValue;
    }
    assert( If_DsdManSuppSize(pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest)) == (int)pCutBest->nLeaves );
    // find the bound set
    if ( pIfMan->pPars->fDelayOptLut )
        uSetOld = pCutBest->uMaskFunc;
    else
        uSetOld = If_DsdManCheckXY( pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest), nLutSize, 1, 0, 1, 0 );
    // remap bound set
    uSetNew = 0;
    pPerm = If_CutDsdPerm( pIfMan, pCutBest );
    for ( k = 0; k < If_CutLeaveNum(pCutBest); k++ )
    {
        int iVar = Abc_Lit2Var((int)pPerm[k]);
        int Value = ((uSetOld >> (k << 1)) & 3);
        if ( Value == 1 )
            uSetNew |= (1 << (2*iVar));
        else if ( Value == 3 )
            uSetNew |= (3 << (2*iVar));
        else assert( Value == 0 );
    }
    RetValue = If_ManSatCheckXY( pSat, nLutSize, If_CutTruthW(pIfMan, pCutBest), pCutBest->nLeaves, uSetNew, &uBound, &uFree, vLits );
    assert( RetValue );
    // collect variables
    for ( k = 0; k < If_CutLeaveNum(pCutBest); k++ )
    {
        int Value = ((uSetNew >> (k << 1)) & 3);
        if ( Value == 0 )
            pVarsF[nVarsF++] = k;
        else if ( Value == 1 )
            pVarsB[nVarsB++] = k;
        else if ( Value == 3 )
            pVarsS[nVarsS++] = k;
        else assert( Value == 0 );
    }
    // collect bound set variables
    Vec_IntClear( vLits );
    for ( k = 0; k < nVarsS; k++ )
        Vec_IntPush( vLits, Vec_IntEntry(vLeaves, pVarsS[k]) );
    for ( k = 0; k < nVarsB; k++ )
        Vec_IntPush( vLits, Vec_IntEntry(vLeaves, pVarsB[k]) );
    RetValue = Gia_ManFromIfLogicCreateLut( pNew, &uBound, vLits, vCover, vMapping, vMapping2 );
    // collecct free set variables
    Vec_IntClear( vLits );
    Vec_IntPush( vLits, RetValue );
    for ( k = 0; k < nVarsS; k++ )
        Vec_IntPush( vLits, Vec_IntEntry(vLeaves, pVarsS[k]) );
    for ( k = 0; k < nVarsF; k++ )
        Vec_IntPush( vLits, Vec_IntEntry(vLeaves, pVarsF[k]) );
    // add packing
    RetValue2 = Gia_ManFromIfLogicCreateLut( pNew, &uFree, vLits, vCover, vMapping, vMapping2 );
    // write packing
    Vec_IntPush( vPacking, 2 );
    Vec_IntPush( vPacking, Abc_Lit2Var(RetValue) );
    Vec_IntPush( vPacking, Abc_Lit2Var(RetValue2) );
    Vec_IntAddToEntry( vPacking, 0, 1 );
    return RetValue2;
}